

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O0

JDIMENSION get_16bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  long in_RSI;
  long in_RDI;
  JDIMENSION col;
  JSAMPROW ptr;
  int t;
  tga_source_ptr source;
  int local_2c;
  UINT8 *local_28;
  
  local_28 = (UINT8 *)**(undefined8 **)(in_RSI + 0x20);
  for (local_2c = *(int *)(in_RDI + 0x30); local_2c != 0; local_2c = local_2c + -1) {
    (**(code **)(in_RSI + 0x50))(in_RSI);
    uVar1 = (uint)*(byte *)(in_RSI + 0x59) * 0x100 + (uint)*(byte *)(in_RSI + 0x58);
    local_28[2] = ""[(int)(uVar1 & 0x1f)];
    local_28[1] = ""[(int)((int)uVar1 >> 5 & 0x1f)];
    *local_28 = ""[(int)((int)uVar1 >> 10 & 0x1f)];
    local_28 = local_28 + 3;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_16bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 16-bit pixels */
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  register int t;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    (*source->read_pixel) (source); /* Load next pixel into tga_pixel */
    t = UCH(source->tga_pixel[0]);
    t += UCH(source->tga_pixel[1]) << 8;
    /* We expand 5 bit data to 8 bit sample width.
     * The format of the 16-bit (LSB first) input word is
     *     xRRRRRGGGGGBBBBB
     */
    ptr[2] = (JSAMPLE)c5to8bits[t & 0x1F];
    t >>= 5;
    ptr[1] = (JSAMPLE)c5to8bits[t & 0x1F];
    t >>= 5;
    ptr[0] = (JSAMPLE)c5to8bits[t & 0x1F];
    ptr += 3;
  }
  return 1;
}